

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O3

tuple<char_*const_*,_bool> __thiscall
pstore::command_line::details::parse_option_arguments<char*const*,std::ostream>
          (details *this,char **first_arg,char **last_arg,string *program_name,
          basic_ostream<char,_std::char_traits<char>_> *errs)

{
  bool bVar1;
  int iVar2;
  type *ptVar3;
  option **ppoVar4;
  ostream *poVar5;
  string *psVar6;
  char **extraout_RDX;
  _Head_base<0UL,_char_*const_*,_false> _Var7;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  char **extraout_RDX_09;
  basic_ostream<char,_std::char_traits<char>_> *in_R9;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  bool bVar12;
  details dVar13;
  tuple<char_*const_*,_bool> tVar14;
  maybe<pstore::command_line::option_*,_void> handler;
  string arg_name;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  maybe<pstore::command_line::option_*,_void> local_168;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *local_150;
  string *local_148;
  details local_140 [8];
  option *local_138;
  maybe<pstore::command_line::option_*,_void> local_130;
  maybe<pstore::command_line::option_*,_void> local_120;
  details *local_110;
  string local_108;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_e8;
  long *local_b8 [2];
  long local_a8 [2];
  string local_98;
  undefined1 local_78 [8];
  type local_70;
  long *local_50 [2];
  long local_40 [2];
  uint uVar11;
  
  local_e8.storage_._8_8_ = 0;
  local_e8.storage_._16_8_ = 0;
  local_e8._0_8_ = 0;
  local_e8.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_e8.storage_._24_8_ = 0;
  local_168._0_8_ = 0;
  local_168.storage_ = (type)0x0;
  local_150 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)program_name;
  local_148 = (string *)errs;
  if (first_arg == last_arg) {
    _Var7._M_head_impl = last_arg;
    bVar9 = 1;
  }
  else {
    uVar11 = 1;
    local_110 = this;
    do {
      std::__cxx11::string::string((string *)&local_108,*first_arg,(allocator *)local_78);
      local_120.valid_ = false;
      bVar12 = local_168.valid_ == true;
      if (bVar12) {
        ptVar3 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
        local_120.storage_ = *ptVar3;
      }
      local_120.valid_ = bVar12;
      bVar12 = handler_takes_argument(&local_120);
      if (local_120.valid_ == true) {
        local_120.valid_ = false;
      }
      if (bVar12) {
        local_130.valid_ = false;
        bVar12 = local_168.valid_ == true;
        if (bVar12) {
          ptVar3 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
          local_130.storage_ = *ptVar3;
        }
        local_130.valid_ = bVar12;
        bVar12 = handler_set_value(&local_130,&local_108);
        uVar10 = uVar11 & 0xff;
        if ((uVar11 & 1) != 0) {
          uVar10 = (uint)bVar12;
        }
        if (local_130.valid_ == true) {
          local_130.valid_ = false;
        }
        _Var7._M_head_impl = extraout_RDX;
        if (local_168.valid_ == true) {
          local_168._0_8_ = local_168._0_8_ & 0xffffffffffffff00;
        }
        goto LAB_001089d1;
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_108);
      if (iVar2 == 0) {
        first_arg = first_arg + 1;
        bVar12 = true;
        _Var7._M_head_impl = extraout_RDX_00;
      }
      else {
        bVar1 = argument_is_positional(&local_108);
        bVar12 = true;
        _Var7._M_head_impl = extraout_RDX_01;
        if (!bVar1) {
          bVar12 = starts_with(&local_108,"--");
          if (bVar12) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            get_option_and_value
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                        *)local_78,&local_98);
            std::__cxx11::string::operator=((string *)&local_108,(string *)local_50);
            maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator=(&local_e8,
                        (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)local_78);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            if (local_78[0] == true) {
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              if ((undefined1 *)CONCAT71(local_70._1_7_,local_70.__data[0]) != local_78 + 0x18) {
                operator_delete((undefined1 *)CONCAT71(local_70._1_7_,local_70.__data[0]),
                                local_70._16_8_ + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            find_handler((maybe<pstore::command_line::option_*,_void> *)local_78,&local_108);
            maybe<pstore::command_line::option_*,_void>::operator=
                      (&local_168,(maybe<pstore::command_line::option_*,_void> *)local_78);
            if (local_168.valid_ == true) {
              ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
              iVar2 = (*(*ppoVar4)->_vptr_option[9])();
              if ((char)iVar2 == '\0') {
                local_140[0] = (details)0x0;
                dVar13 = (details)(local_168.valid_ == true);
                if ((bool)dVar13) {
                  ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
                  local_138 = *ppoVar4;
                }
                errs = (basic_ostream<char,_std::char_traits<char>_> *)local_148;
                local_140[0] = dVar13;
                record_value_if_available<std::ostream>
                          ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)
                           local_78,local_140,
                           (maybe<pstore::command_line::option_*,_void> *)&local_e8,local_150,
                           local_148,in_R9);
                maybe<pstore::command_line::option_*,_void>::operator=
                          (&local_168,(maybe<pstore::command_line::option_*,_void> *)(local_78 + 8))
                ;
                uVar10 = local_78._0_4_;
                if ((uVar11 & 1) == 0) {
                  uVar10 = uVar11 & 0xff;
                }
                _Var7._M_head_impl = extraout_RDX_06;
                if (local_140[0] == (details)0x1) {
                  local_140[0] = (details)0x0;
                }
                goto LAB_001089d1;
              }
            }
            report_unknown_option<std::ostream>
                      ((string *)local_150,&local_108,&local_e8,
                       (basic_ostream<char,_std::char_traits<char>_> *)local_148);
            bVar12 = false;
            uVar10 = uVar11 & 1;
            _Var7._M_head_impl = extraout_RDX_02;
            uVar11 = uVar11 & 0xff;
            if (uVar10 != 0) {
              uVar11 = 0;
            }
          }
          else {
            local_b8[0] = local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b8,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            process_single_dash<std::ostream>
                      ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)local_78,
                       (details *)local_b8,(string *)local_150,local_148,errs);
            maybe<pstore::command_line::option_*,_void>::operator=
                      (&local_168,(maybe<pstore::command_line::option_*,_void> *)(local_78 + 8));
            uVar10 = local_78._0_4_;
            if ((uVar11 & 1) == 0) {
              uVar10 = uVar11 & 0xff;
            }
            if (local_70.__data[0] == '\x01') {
              local_70.__data[0] = '\0';
            }
            _Var7._M_head_impl = extraout_RDX_04;
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0],local_a8[0] + 1);
              _Var7._M_head_impl = extraout_RDX_05;
            }
LAB_001089d1:
            bVar12 = false;
            uVar11 = uVar10;
          }
        }
      }
      bVar8 = (byte)uVar11;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        _Var7._M_head_impl = extraout_RDX_03;
      }
    } while ((!bVar12) && (first_arg = first_arg + 1, first_arg != last_arg));
    this = local_110;
    bVar9 = bVar8;
    if ((local_168._0_8_ & 1) != 0) {
      ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
      iVar2 = (*(*ppoVar4)->_vptr_option[0xe])();
      this = local_110;
      _Var7._M_head_impl = extraout_RDX_07;
      if ((char)iVar2 != '\0') {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_148,*(char **)local_150,
                            (long)(local_150->storage_).__align);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": Argument \'",0xc);
        ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(&local_168);
        psVar6 = option::name_abi_cxx11_(*ppoVar4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' requires a value\n",0x13);
        _Var7._M_head_impl = extraout_RDX_08;
        bVar9 = 0;
        if ((uVar11 & 1) == 0) {
          bVar9 = bVar8;
        }
      }
    }
  }
  *this = (details)(bVar9 & 1);
  *(char ***)(this + 8) = first_arg;
  if ((local_e8.valid_ == true) &&
     (local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00,
     local_e8.storage_.__align !=
     (anon_struct_8_0_00000001_for___align)((long)&local_e8.storage_ + 0x10))) {
    operator_delete((void *)local_e8.storage_.__align,local_e8.storage_._16_8_ + 1);
    _Var7._M_head_impl = extraout_RDX_09;
  }
  tVar14.super__Tuple_impl<0UL,_char_*const_*,_bool>.super__Head_base<0UL,_char_*const_*,_false>.
  _M_head_impl = _Var7._M_head_impl;
  tVar14.super__Tuple_impl<0UL,_char_*const_*,_bool>._0_8_ = this;
  return (tuple<char_*const_*,_bool>)tVar14.super__Tuple_impl<0UL,_char_*const_*,_bool>;
}

Assistant:

std::tuple<InputIterator, bool>
            parse_option_arguments (InputIterator first_arg, InputIterator last_arg,
                                    std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                auto value = nothing<std::string> ();
                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};

                for (; first_arg != last_arg; ++first_arg) {
                    std::string arg_name = *first_arg;
                    // Is this the argument for the preceeding switch?
                    if (handler_takes_argument (handler)) {
                        ok = handler_set_value (handler, arg_name);
                        handler.reset ();
                        continue;
                    }

                    // A double-dash argument on its own indicates that the following are
                    // positional arguments.
                    if (arg_name == "--") {
                        ++first_arg; // swallow this argument.
                        break;
                    }
                    // If this argument has no leading dash, this and the following are
                    // positional arguments.
                    if (argument_is_positional (arg_name)) {
                        break;
                    }

                    if (starts_with (arg_name, "--")) {
                        std::tie (arg_name, value) = get_option_and_value (arg_name);

                        handler = find_handler (arg_name);
                        if (!handler || (*handler)->is_positional ()) {
                            report_unknown_option (program_name, arg_name, value, errs);
                            ok = false;
                            continue;
                        }

                        std::tie (handler, ok) =
                            record_value_if_available (handler, value, program_name, errs);
                    } else {
                        std::tie (handler, ok) = process_single_dash (arg_name, program_name, errs);
                    }
                }

                if (handler && (*handler)->takes_argument ()) {
                    errs << str::out_string (program_name) << str::out_text (": Argument '")
                         << str::out_string ((*handler)->name ())
                         << str::out_text ("' requires a value\n");
                    ok = false;
                }
                return std::make_tuple (first_arg, static_cast<bool> (ok));
            }